

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O0

UBool icu_63::UnicodeSet::resemblesPattern(UnicodeString *pattern,int32_t pos)

{
  UBool UVar1;
  char16_t cVar2;
  int32_t iVar3;
  int32_t pos_local;
  UnicodeString *pattern_local;
  
  iVar3 = UnicodeString::length(pattern);
  if ((pos + 1 < iVar3) && (cVar2 = UnicodeString::charAt(pattern,pos), cVar2 == L'[')) {
    return '\x01';
  }
  UVar1 = resemblesPropertyPattern(pattern,pos);
  return UVar1 != '\0';
}

Assistant:

UBool UnicodeSet::resemblesPattern(const UnicodeString& pattern, int32_t pos) {
    return ((pos+1) < pattern.length() &&
            pattern.charAt(pos) == (UChar)91/*[*/) ||
        resemblesPropertyPattern(pattern, pos);
}